

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.h
# Opt level: O0

bool Memory::HeapBlockList::
     Contains<Memory::SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>>
               (SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *block,
               SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *list,
               SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *tail)

{
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *local_30;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *heapBlock;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *tail_local;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *list_local;
  SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *block_local;
  
  local_30 = list;
  while( true ) {
    if (local_30 == tail) {
      return false;
    }
    if (local_30 == block) break;
    local_30 = SmallNormalWithBarrierHeapBlockT<MediumAllocationBlockAttributes>::GetNextBlock
                         (local_30);
  }
  return true;
}

Assistant:

static bool Contains(TBlockType * block, TBlockType * list, TBlockType * tail = nullptr)
    {
        TBlockType * heapBlock = list;
        while (heapBlock != tail)
        {
            if (heapBlock == block)
            {
                return true;
            }
            heapBlock = heapBlock->GetNextBlock();
        }
        return false;
    }